

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long_long lhs,
         SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  short sVar2;
  short in_SI;
  unsigned_long_long in_RDI;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *unaff_retaddr;
  unsigned_long_long ret;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_00000014;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined6 in_stack_ffffffffffffffd8;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_12;
  unsigned_long_long local_10;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  short local_2;
  
  local_10 = in_RDI;
  local_4.m_int = in_SI;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_12);
  bVar1 = DivisionCornerCaseHelper<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(ret,in_stack_00000014,unaff_retaddr);
  if (bVar1) {
    local_2 = local_12.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_10,local_4,&local_12);
    if (bVar1) {
      local_2 = local_12.m_int;
    }
    else {
      this = (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0;
      sVar2 = SafeInt::operator_cast_to_short
                        ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0
                        );
      DivisionHelper<unsigned_long_long,_short,_1>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((unsigned_long_long *)this,(short *)CONCAT26(sVar2,in_stack_ffffffffffffffd8),
                 (unsigned_long_long *)0x191da7);
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long_long>
                (this,(unsigned_long_long *)CONCAT26(sVar2,in_stack_ffffffffffffffd8));
    }
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}